

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O0

void __thiscall
YdiskRestClient::uploadFile(YdiskRestClient *this,string *path,ifstream *ifstream,BOOL overwrite)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  SSLClient *path_00;
  bool bVar1;
  Headers *pHVar2;
  element_type *peVar3;
  element_type *peVar4;
  Json *this_01;
  string *psVar5;
  streambuf *psVar6;
  const_reference pvVar7;
  runtime_error *this_02;
  char *pcVar8;
  string local_408 [32];
  undefined1 local_3e8 [8];
  shared_ptr<httplib::Response> r2;
  SSLClient cli2;
  string_type local_330;
  undefined1 local_310 [8];
  regex pattern;
  smatch m;
  string request_url;
  string server_url;
  stringstream body;
  ostream local_280 [383];
  allocator local_101;
  string local_100;
  undefined1 local_e0 [8];
  Json json;
  string error;
  undefined1 local_90 [8];
  shared_ptr<httplib::Response> r;
  allocator local_49;
  undefined1 local_48 [8];
  string url;
  BOOL overwrite_local;
  ifstream *ifstream_local;
  string *path_local;
  YdiskRestClient *this_local;
  
  url.field_2._12_4_ = overwrite;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,"/v1/disk/resources/upload?path=",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  url_encode((string *)
             &r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount,this,
             path);
  std::__cxx11::string::operator+=
            ((string *)local_48,
             (string *)
             &r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string
            ((string *)
             &r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::operator+=((string *)local_48,"&overwrite=");
  pcVar8 = "false";
  if (url.field_2._12_4_ != 0) {
    pcVar8 = "true";
  }
  std::__cxx11::string::operator+=((string *)local_48,pcVar8);
  path_00 = this->http_client;
  pHVar2 = (Headers *)std::__cxx11::string::c_str();
  std::function<bool_(unsigned_long,_unsigned_long)>::function
            ((function<bool_(unsigned_long,_unsigned_long)> *)((long)&error.field_2 + 8),
             (nullptr_t)0x0);
  httplib::Client::Get((Client *)local_90,(char *)path_00,pHVar2,(Progress *)&this->headers);
  std::function<bool_(unsigned_long,_unsigned_long)>::~function
            ((function<bool_(unsigned_long,_unsigned_long)> *)((long)&error.field_2 + 8));
  peVar3 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_90);
  if ((peVar3 == (element_type *)0x0) ||
     (peVar4 = std::__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_90), peVar4->status != 200)) {
    peVar3 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_90);
    throw_response_error(this,peVar3);
  }
  else {
    this_00 = &json.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    std::__cxx11::string::string((string *)this_00);
    peVar4 = std::__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_90);
    json11::Json::parse((string *)local_e0,&peVar4->body,(JsonParse)this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"href",&local_101);
    this_01 = json11::Json::operator[]((Json *)local_e0,&local_100);
    psVar5 = json11::Json::string_value_abi_cxx11_(this_01);
    std::__cxx11::string::operator=((string *)local_48,(string *)psVar5);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    json11::Json::~Json((Json *)local_e0);
    std::__cxx11::string::~string
              ((string *)
               &json.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)(server_url.field_2._M_local_buf + 8));
  psVar6 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_280,psVar6);
  std::__cxx11::string::string((string *)(request_url.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&m._M_begin);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&pattern._M_automaton.
                      super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_310,
             "https://(.+?):443(/.+)",0x10);
  bVar1 = std::
          regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&pattern._M_automaton.
                         super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_310,0);
  if (bVar1) {
    pvVar7 = std::__cxx11::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&pattern._M_automaton.
                              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount,1);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_330,pvVar7);
    std::__cxx11::string::operator=
              ((string *)(request_url.field_2._M_local_buf + 8),(string *)&local_330);
    std::__cxx11::string::~string((string *)&local_330);
    pvVar7 = std::__cxx11::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&pattern._M_automaton.
                              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount,2);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&cli2.ctx_mutex_.super___mutex_base._M_mutex.__data.__list.__next,pvVar7);
    std::__cxx11::string::operator=
              ((string *)&m._M_begin,
               (string *)&cli2.ctx_mutex_.super___mutex_base._M_mutex.__data.__list.__next);
    std::__cxx11::string::~string
              ((string *)&cli2.ctx_mutex_.super___mutex_base._M_mutex.__data.__list.__next);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    httplib::SSLClient::SSLClient
              ((SSLClient *)
               &r2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               pcVar8,0x1bb,300);
    pHVar2 = (Headers *)std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    httplib::Client::Put
              ((Client *)local_3e8,
               (char *)&r2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,pHVar2,(string *)&this->headers,(char *)local_408);
    std::__cxx11::string::~string(local_408);
    peVar3 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_3e8);
    if ((peVar3 == (element_type *)0x0) ||
       ((peVar4 = std::
                  __shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_3e8), peVar4->status != 0xc9 &&
        (peVar4 = std::
                  __shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_3e8), peVar4->status != 0xca)))) {
      peVar3 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_3e8);
      throw_response_error(this,peVar3);
    }
    std::shared_ptr<httplib::Response>::~shared_ptr((shared_ptr<httplib::Response> *)local_3e8);
    httplib::SSLClient::~SSLClient
              ((SSLClient *)
               &r2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_310);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&pattern._M_automaton.
                         super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
    std::__cxx11::string::~string((string *)&m._M_begin);
    std::__cxx11::string::~string((string *)(request_url.field_2._M_local_buf + 8));
    std::__cxx11::stringstream::~stringstream((stringstream *)(server_url.field_2._M_local_buf + 8))
    ;
    std::shared_ptr<httplib::Response>::~shared_ptr((shared_ptr<httplib::Response> *)local_90);
    std::__cxx11::string::~string((string *)local_48);
    return;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_02,"Error parsing file href for upload");
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void YdiskRestClient::uploadFile(std::string path, std::ifstream& ifstream, BOOL overwrite)
{
    std::string url("/v1/disk/resources/upload?path=");
    url += url_encode(path);
    url += "&overwrite=";
    url += (overwrite ? "true": "false");

    auto r = http_client->Get(url.c_str(), headers);
    if(r.get() && r->status==200){
        std::string error;
        const auto json = Json::parse(r->body, error);
        url = json["href"].string_value();
    } else {
        throw_response_error(r.get());
    }

    std::stringstream body;
    body << ifstream.rdbuf();

    std::string server_url, request_url;
    std::smatch m;
    auto pattern = std::regex("https://(.+?):443(/.+)");
    if (std::regex_search(url, m, pattern)) {
        server_url = m[1].str();
        request_url = m[2].str();
    } else {
        throw std::runtime_error("Error parsing file href for upload");
    }

    httplib::SSLClient cli2(server_url.c_str(), 443);
    auto r2 = cli2.Put(request_url.c_str(), headers, body.str(), "application/octet-stream");

    if(r2.get() && (r2->status==201 || r2->status==202)){
        return;
    } else {
        throw_response_error(r2.get());
    }
}